

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.cpp
# Opt level: O0

int main(void)

{
  char *__s;
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  exception *e;
  stringstream local_288 [8];
  stringstream ss;
  ostream local_278 [376];
  string local_100 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> as_str;
  uint compare_with;
  uint32_t as_int;
  Roman_int rint;
  _Self local_b0;
  iterator it;
  string local_a0;
  undefined1 local_80 [8];
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  test_map;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *file_name;
  
  file_name._4_4_ = 0;
  local_18 = "problem_6_test.txt";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"problem_6_test.txt",&local_39);
  generate_test_file(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  __s = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,__s,(allocator<char> *)((long)&it._M_node + 7));
  read_test_file((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_80,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it._M_node + 7));
  local_b0._M_node =
       (_Base_ptr)
       std::
       map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_80);
  while( true ) {
    rint.m_numerals.field_2._8_8_ =
         std::
         map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_80);
    bVar1 = std::operator!=(&local_b0,(_Self *)((long)&rint.m_numerals.field_2 + 8));
    if (!bVar1) {
      std::operator<<((ostream *)&std::cout,"Test passed\n");
      std::
      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_80);
      return file_name._4_4_;
    }
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b0);
    Roman_int::Roman_int((Roman_int *)&compare_with,&ppVar2->second);
    as_str.field_2._12_4_ = Roman_int::as_int((Roman_int *)&compare_with);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b0);
    as_str.field_2._8_4_ = ppVar2->first;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_b0);
    std::__cxx11::string::string(local_100,(string *)&ppVar2->second);
    std::__cxx11::stringstream::stringstream(local_288);
    poVar3 = std::operator<<(local_278,local_100);
    poVar3 = std::operator<<(poVar3," == ");
    std::ostream::operator<<(poVar3,as_str.field_2._12_4_);
    std::__cxx11::stringstream::str();
    if (as_str.field_2._8_4_ != as_str.field_2._12_4_) break;
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::stringstream::~stringstream(local_288);
    std::__cxx11::string::~string(local_100);
    Roman_int::~Roman_int((Roman_int *)&compare_with);
    std::
    _Rb_tree_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&local_b0);
  }
  __assert_fail("(ss.str(), compare_with == as_int)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vocasle[P]principles_and_practice_using_cpp/part_2_input_and_output/ch_10/problem_6.cpp"
                ,0x18,"int main()");
}

Assistant:

int main()
{
	try
	{
		auto file_name{ "problem_6_test.txt" };
		generate_test_file(file_name);
		auto test_map = read_test_file(file_name);
		for (auto it = test_map.begin(); it != test_map.end(); ++it)
		{
			Roman_int rint{ it->second };
			auto as_int = rint.as_int();
			auto compare_with = it->first;
			auto as_str = it->second;
			std::stringstream ss;
			ss << as_str << " == " << as_int;
			assert((ss.str(), compare_with == as_int));
		}
		
		std::cout << "Test passed\n";
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}
}